

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O2

DdApaDigit
Cudd_ApaShortDivision(int digits,DdApaNumber dividend,DdApaDigit divisor,DdApaNumber quotient)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)digits;
  if (digits < 1) {
    uVar3 = uVar4;
  }
  uVar2 = 0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    uVar1 = (ulong)dividend[uVar4] | uVar2 << 0x20;
    uVar2 = uVar1 % (ulong)divisor;
    quotient[uVar4] = (DdApaDigit)(uVar1 / divisor);
  }
  return (DdApaDigit)uVar2;
}

Assistant:

DdApaDigit
Cudd_ApaShortDivision(
  int  digits,
  DdApaNumber  dividend,
  DdApaDigit  divisor,
  DdApaNumber  quotient)
{
    int i;
    DdApaDigit remainder;
    DdApaDoubleDigit partial;

    remainder = 0;
    for (i = 0; i < digits; i++) {
        partial = remainder * DD_APA_BASE + dividend[i];
        quotient[i] = (DdApaDigit) (partial/(DdApaDoubleDigit)divisor);
        remainder = (DdApaDigit) (partial % divisor);
    }

    return(remainder);

}